

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_7c5df::lower_ubo_reference_visitor::visit_enter
          (lower_ubo_reference_visitor *this,ir_call *ir)

{
  ir_node_type iVar1;
  uint uVar2;
  ir_intrinsic_id iVar3;
  ir_function_signature *piVar4;
  ir_instruction *piVar5;
  uint uVar6;
  int iVar7;
  glsl_interface_packing packing;
  ir_visitor_status iVar8;
  long lVar9;
  undefined4 extraout_var;
  void *pvVar10;
  operand b;
  ir_expression *piVar11;
  undefined4 extraout_var_00;
  ir_variable *piVar12;
  glsl_type *type;
  ir_function_signature *this_00;
  ir_function *this_01;
  undefined4 extraout_var_01;
  ir_call *this_02;
  uint uVar13;
  exec_node *peVar14;
  exec_node *peVar15;
  exec_node *node;
  exec_node *peVar16;
  ir_rvalue *piVar17;
  exec_node **ppeVar18;
  bool row_major;
  void *local_f0;
  ir_function_signature *local_e8;
  uint const_offset;
  exec_list sig_params;
  glsl_type *matrix_type;
  ir_rvalue *offset;
  exec_list local_98;
  char func_name [64];
  
  peVar15 = (ir->actual_parameters).head_sentinel.next;
  uVar13 = 0xffffffff;
  peVar16 = peVar15;
  do {
    peVar16 = peVar16->next;
    uVar13 = uVar13 + 1;
  } while (peVar16 != (exec_node *)0x0);
  this_02 = ir;
  if (1 < uVar13) {
    uVar13 = 0xffffffff;
    peVar16 = peVar15;
    do {
      peVar16 = peVar16->next;
      uVar13 = uVar13 + 1;
    } while (peVar16 != (exec_node *)0x0);
    if (uVar13 < 4) {
      peVar16 = &(ir->actual_parameters).tail_sentinel;
      peVar14 = (exec_node *)0x0;
      if (peVar15 != peVar16) {
        peVar14 = peVar15;
      }
      if (*(uint *)&peVar14[1].next < 7) {
        lVar9 = (*(code *)peVar14[-1].prev[4].next)(&peVar14[-1].prev);
        if ((((lVar9 != 0) && ((*(uint *)(lVar9 + 0x40) & 0xf000) == 0x2000)) &&
            (*(long *)(lVar9 + 0x88) != 0)) &&
           (ir->callee->intrinsic_id - ir_intrinsic_generic_atomic_add < 8)) {
          peVar15 = (ir->actual_parameters).head_sentinel.next;
          uVar13 = 0xffffffff;
          peVar14 = peVar15;
          do {
            peVar14 = peVar14->next;
            uVar13 = uVar13 + 1;
          } while (peVar14 != (exec_node *)0x0);
          if ((uVar13 & 0xfffffffe) != 2) {
            __assert_fail("param_count == 2 || param_count == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x3c2,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          peVar14 = (exec_node *)0x0;
          if (peVar15 != peVar16) {
            peVar14 = peVar15;
          }
          piVar17 = (ir_rvalue *)&peVar14[-1].prev;
          if (peVar14 == (exec_node *)0x0) {
            piVar17 = (ir_rvalue *)0x0;
          }
          iVar1 = (piVar17->super_ir_instruction).ir_type;
          if ((ir_type_dereference_variable < iVar1) && (iVar1 != ir_type_swizzle)) {
            __assert_fail("inst->ir_type == ir_type_dereference_variable || inst->ir_type == ir_type_dereference_array || inst->ir_type == ir_type_dereference_record || inst->ir_type == ir_type_swizzle"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                          ,0x3ca,
                          "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                         );
          }
          if (piVar17->type->vector_elements == '\x01') {
            uVar2 = *(uint *)&piVar17->type->field_0x4;
            uVar6 = uVar2 & 0xfe;
            if ((uVar6 < 0xe) && ((uVar2 & 0xff) == 2 || uVar6 == 0)) {
              iVar7 = (*(piVar17->super_ir_instruction)._vptr_ir_instruction[8])(piVar17);
              piVar12 = (ir_variable *)CONCAT44(extraout_var,iVar7);
              if (piVar12 == (ir_variable *)0x0) {
                __assert_fail("var",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,0x3d1,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              pvVar10 = ralloc_parent(this->shader->ir);
              offset = (ir_rvalue *)0x0;
              packing = glsl_type::get_internal_ifc_packing
                                  (piVar12->interface_type,
                                   (bool)(this->super_lower_buffer_access).
                                         super_ir_rvalue_enter_visitor.super_ir_rvalue_base_visitor.
                                         super_ir_hierarchical_visitor.field_0x31);
              *(undefined4 *)
               &(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 = 4;
              this->variable = piVar12;
              local_e8 = (ir_function_signature *)piVar17;
              setup_for_load_or_store
                        (this,pvVar10,piVar12,piVar17,&offset,&const_offset,&row_major,&matrix_type,
                         packing);
              piVar17 = offset;
              if (offset == (ir_rvalue *)0x0) {
                __assert_fail("offset",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,1000,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              if (row_major == true) {
                __assert_fail("!row_major",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,0x3e9,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              if (matrix_type != (glsl_type *)0x0) {
                __assert_fail("matrix_type == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,0x3ea,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              b.val = (ir_rvalue *)exec_node::operator_new(0xb0,pvVar10);
              ir_constant::ir_constant((ir_constant *)b.val,const_offset,1);
              piVar11 = ir_builder::add((operand)piVar17,b);
              iVar7 = (*(this->uniform_block->super_ir_instruction)._vptr_ir_instruction[4])
                                (this->uniform_block,pvVar10,0);
              sig_params.head_sentinel.next = &sig_params.tail_sentinel;
              sig_params.head_sentinel.prev = (exec_node *)0x0;
              sig_params.tail_sentinel.next = (exec_node *)0x0;
              sig_params.tail_sentinel.prev = &sig_params.head_sentinel;
              local_f0 = pvVar10;
              piVar12 = (ir_variable *)exec_node::operator_new(0x90,pvVar10);
              ir_variable::ir_variable
                        (piVar12,&glsl_type::_uint_type,"block_ref",ir_var_function_in);
              peVar15 = &(piVar12->super_ir_instruction).super_exec_node;
              (piVar12->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
              (piVar12->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
              (sig_params.tail_sentinel.prev)->next = peVar15;
              sig_params.tail_sentinel.prev = peVar15;
              piVar12 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
              ir_variable::ir_variable(piVar12,&glsl_type::_uint_type,"offset",ir_var_function_in);
              peVar15 = &(piVar12->super_ir_instruction).super_exec_node;
              (piVar12->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
              (piVar12->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
              (sig_params.tail_sentinel.prev)->next = peVar15;
              sig_params.tail_sentinel.prev = peVar15;
              type = glsl_type::get_scalar_type(local_e8->return_type);
              piVar12 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
              ir_variable::ir_variable(piVar12,type,"data1",ir_var_function_in);
              pvVar10 = local_f0;
              peVar15 = &(piVar12->super_ir_instruction).super_exec_node;
              (piVar12->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
              (piVar12->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev;
              (sig_params.tail_sentinel.prev)->next = peVar15;
              sig_params.tail_sentinel.prev = peVar15;
              if (uVar13 == 3) {
                piVar12 = (ir_variable *)exec_node::operator_new(0x90,local_f0);
                ir_variable::ir_variable(piVar12,type,"data2",ir_var_function_in);
                peVar15 = &(piVar12->super_ir_instruction).super_exec_node;
                (piVar12->super_ir_instruction).super_exec_node.next = &sig_params.tail_sentinel;
                (piVar12->super_ir_instruction).super_exec_node.prev = sig_params.tail_sentinel.prev
                ;
                (sig_params.tail_sentinel.prev)->next = peVar15;
                sig_params.tail_sentinel.prev = peVar15;
              }
              this_00 = (ir_function_signature *)exec_node::operator_new(0x88,pvVar10);
              ir_function_signature::ir_function_signature
                        (this_00,local_e8->return_type,shader_storage_buffer_object);
              ir_function_signature::replace_parameters(this_00,&sig_params);
              piVar4 = ir->callee;
              iVar3 = piVar4->intrinsic_id;
              if ((int)iVar3 < 1) {
                __assert_fail("ir->callee->intrinsic_id >= ir_intrinsic_generic_load",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,0x40d,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              if (10 < (int)iVar3) {
                __assert_fail("ir->callee->intrinsic_id <= ir_intrinsic_generic_atomic_comp_swap",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                              ,0x40e,
                              "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                             );
              }
              this_00->intrinsic_id = iVar3 + ir_intrinsic_image_atomic_dec_wrap;
              sprintf(func_name,"%s_ssbo",piVar4->_function->name);
              this_01 = (ir_function *)exec_node::operator_new(0x60,local_f0);
              ir_function::ir_function(this_01,func_name);
              pvVar10 = local_f0;
              this_00->_function = this_01;
              peVar16 = &(this_00->super_ir_instruction).super_exec_node;
              (this_00->super_ir_instruction).super_exec_node.next =
                   &(this_01->signatures).tail_sentinel;
              peVar15 = (this_01->signatures).tail_sentinel.prev;
              (this_00->super_ir_instruction).super_exec_node.prev = peVar15;
              peVar15->next = peVar16;
              (this_01->signatures).tail_sentinel.prev = peVar16;
              peVar15 = &local_98.tail_sentinel;
              local_98.head_sentinel.prev = (exec_node *)0x0;
              local_98.tail_sentinel.next = (exec_node *)0x0;
              local_98.head_sentinel.next = (exec_node *)(CONCAT44(extraout_var_00,iVar7) + 8);
              if (CONCAT44(extraout_var_00,iVar7) == 0) {
                local_98.head_sentinel.next = (exec_node *)0x0;
              }
              (local_98.head_sentinel.next)->next = peVar15;
              (local_98.head_sentinel.next)->prev = &local_98.head_sentinel;
              local_98.tail_sentinel.prev =
                   &(piVar11->super_ir_rvalue).super_ir_instruction.super_exec_node;
              if (piVar11 == (ir_expression *)0x0) {
                local_98.tail_sentinel.prev = (exec_node *)0x0;
              }
              (local_98.tail_sentinel.prev)->next = peVar15;
              (local_98.tail_sentinel.prev)->prev = local_98.head_sentinel.next;
              (local_98.head_sentinel.next)->next = local_98.tail_sentinel.prev;
              peVar16 = ((ir->actual_parameters).head_sentinel.next)->next;
              ppeVar18 = &peVar16[-1].prev;
              if (6 < *(uint *)&peVar16[1].next) {
                ppeVar18 = (exec_node **)0x0;
              }
              local_e8 = this_00;
              lVar9 = (*(code *)(*ppeVar18)[2].next)(ppeVar18,local_f0,0);
              peVar14 = (exec_node *)(lVar9 + 8);
              if (lVar9 == 0) {
                peVar14 = (exec_node *)0x0;
              }
              peVar14->next = peVar15;
              peVar14->prev = local_98.tail_sentinel.prev;
              (local_98.tail_sentinel.prev)->next = peVar14;
              local_98.tail_sentinel.prev = peVar14;
              if (uVar13 == 3) {
                ppeVar18 = &peVar16->next[-1].prev;
                if (6 < *(uint *)&peVar16->next[1].next) {
                  ppeVar18 = (exec_node **)0x0;
                }
                lVar9 = (*(code *)(*ppeVar18)[2].next)(ppeVar18,pvVar10,0);
                peVar15 = (exec_node *)(lVar9 + 8);
                if (lVar9 == 0) {
                  peVar15 = (exec_node *)0x0;
                }
                peVar15->next = &local_98.tail_sentinel;
                peVar15->prev = local_98.tail_sentinel.prev;
                (local_98.tail_sentinel.prev)->next = peVar15;
                local_98.tail_sentinel.prev = peVar15;
              }
              iVar7 = (*(ir->return_deref->super_ir_dereference).super_ir_rvalue.
                        super_ir_instruction._vptr_ir_instruction[4])(ir->return_deref,pvVar10,0);
              this_02 = (ir_call *)exec_node::operator_new(0x60,pvVar10);
              ir_call::ir_call(this_02,local_e8,
                               (ir_dereference_variable *)CONCAT44(extraout_var_01,iVar7),&local_98)
              ;
              goto LAB_0017a738;
            }
          }
          __assert_fail("deref->type->is_scalar() && (deref->type->is_integer_32() || deref->type->is_float())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_ubo_reference.cpp"
                        ,0x3ce,
                        "ir_call *(anonymous namespace)::lower_ubo_reference_visitor::lower_ssbo_atomic_intrinsic(ir_call *)"
                       );
        }
      }
    }
  }
LAB_0017a738:
  if (this_02 == ir) {
    iVar8 = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  }
  else {
    this->progress = true;
    piVar5 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    peVar15 = &(this_02->super_ir_instruction).super_exec_node;
    if (this_02 == (ir_call *)0x0) {
      peVar15 = (exec_node *)0x0;
    }
    peVar15->prev = (piVar5->super_exec_node).prev;
    peVar15->next = (piVar5->super_exec_node).next;
    ((piVar5->super_exec_node).prev)->next = peVar15;
    ((piVar5->super_exec_node).next)->prev = peVar15;
    iVar8 = visit_continue_with_parent;
  }
  return iVar8;
}

Assistant:

ir_visitor_status
lower_ubo_reference_visitor::visit_enter(ir_call *ir)
{
   ir_call *new_ir = check_for_ssbo_atomic_intrinsic(ir);
   if (new_ir != ir) {
      progress = true;
      base_ir->replace_with(new_ir);
      return visit_continue_with_parent;
   }

   return rvalue_visit(ir);
}